

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O1

void printobj(global_State *g,GCObject *o)

{
  byte bVar1;
  ulong uVar2;
  
  bVar1 = o->marked;
  uVar2 = 100;
  if ((((g->currentwhite ^ 0x18) & bVar1) == 0) && (uVar2 = 0x62, (bVar1 & 0x20) == 0)) {
    uVar2 = (ulong)((uint)((bVar1 & 0x18) != 0) << 4 | 0x67);
  }
  printf("||%s(%p)-%c%c(%02X)||",luaT_typenames_[(ulong)(o->tt & 0xf) + 1],o,uVar2,
         (ulong)(uint)(int)"ns01oTt"[bVar1 & 7]);
  if ((o->tt | 0x10) == 0x14) {
    if ((o->tt & 0xf) == 4) {
      printf(" \'%s\'",&o[1].tt);
      return;
    }
    __assert_fail("(((o)->tt) & 0x0F) == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0xe5,"void printobj(global_State *, GCObject *)");
  }
  return;
}

Assistant:

static void printobj (global_State *g, GCObject *o) {
  printf("||%s(%p)-%c%c(%02X)||",
           ttypename(novariant(o->tt)), (void *)o,
           isdead(g,o) ? 'd' : isblack(o) ? 'b' : iswhite(o) ? 'w' : 'g',
           "ns01oTt"[getage(o)], o->marked);
  if (o->tt == LUA_TSHRSTR || o->tt == LUA_TLNGSTR)
    printf(" '%s'", getstr(gco2ts(o)));
}